

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.cpp
# Opt level: O3

int __thiscall crypto::arc4::init(arc4 *this,EVP_PKEY_CTX *ctx)

{
  uint8_t *puVar1;
  long lVar2;
  ulong in_RDX;
  size_t i;
  ulong uVar3;
  byte bVar4;
  uchar __tmp;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  
  this->a = 0;
  this->b = 0;
  uVar5 = '\0';
  uVar6 = '\x01';
  uVar7 = '\x02';
  uVar8 = '\x03';
  uVar9 = '\x04';
  uVar10 = '\x05';
  uVar11 = '\x06';
  uVar12 = '\a';
  uVar13 = '\b';
  uVar14 = '\t';
  uVar15 = '\n';
  uVar16 = '\v';
  uVar17 = '\f';
  uVar18 = '\r';
  uVar19 = '\x0e';
  uVar20 = '\x0f';
  lVar2 = 0;
  do {
    puVar1 = this->state + lVar2;
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    puVar1[2] = uVar7;
    puVar1[3] = uVar8;
    puVar1[4] = uVar9;
    puVar1[5] = uVar10;
    puVar1[6] = uVar11;
    puVar1[7] = uVar12;
    puVar1[8] = uVar13;
    puVar1[9] = uVar14;
    puVar1[10] = uVar15;
    puVar1[0xb] = uVar16;
    puVar1[0xc] = uVar17;
    puVar1[0xd] = uVar18;
    puVar1[0xe] = uVar19;
    puVar1[0xf] = uVar20;
    lVar2 = lVar2 + 0x10;
    uVar5 = uVar5 + '\x10';
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
  } while (lVar2 != 0x100);
  uVar3 = 0;
  bVar4 = 0;
  do {
    uVar5 = this->state[uVar3];
    bVar4 = bVar4 + uVar5 + (char)ctx[uVar3 % in_RDX];
    this->state[uVar3] = this->state[bVar4];
    this->state[bVar4] = uVar5;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x100);
  return (int)bVar4;
}

Assistant:

void arc4::init(const char * key, size_t length) {
	
	a = b = 0;
	
	for(size_t i = 0; i < sizeof(state); i++){
		state[i] = boost::uint8_t(i);
	}
	
	size_t j = 0;
	for(size_t i = 0; i < sizeof(state); i++) {
		j = (j + state[i] + boost::uint8_t(key[i % length])) % sizeof(state);
		std::swap(state[i], state[j]);
	}
	
}